

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator/=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint_error *this_00;
  uint shift;
  long in_FS_OFFSET;
  allocator<char> local_91;
  string local_90;
  base_uint<256U> num;
  base_uint<256U> div;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&div,b);
  base_uint(&num,this);
  operator=(this,0);
  uVar3 = bits(&num);
  uVar4 = bits(&div);
  if (uVar4 == 0) {
    this_00 = (uint_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Division by zero",&local_91);
    uint_error::uint_error(this_00,&local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&uint_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    shift = uVar3 - uVar4;
    if ((int)uVar4 <= (int)uVar3) {
      operator<<=(&div,shift);
      for (; -1 < (int)shift; shift = shift - 1) {
        bVar2 = operator>=(&num,&div);
        if (bVar2) {
          operator-=(&num,&div);
          this->pn[shift >> 5] = this->pn[shift >> 5] | 1 << ((byte)shift & 0x1f);
        }
        operator>>=(&div,1);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return this;
    }
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator/=(const base_uint& b)
{
    base_uint<BITS> div = b;     // make a copy, so we can shift.
    base_uint<BITS> num = *this; // make a copy, so we can subtract.
    *this = 0;                   // the quotient.
    int num_bits = num.bits();
    int div_bits = div.bits();
    if (div_bits == 0)
        throw uint_error("Division by zero");
    if (div_bits > num_bits) // the result is certainly 0.
        return *this;
    int shift = num_bits - div_bits;
    div <<= shift; // shift so that div and num align.
    while (shift >= 0) {
        if (num >= div) {
            num -= div;
            pn[shift / 32] |= (1U << (shift & 31)); // set a bit of the result.
        }
        div >>= 1; // shift back.
        shift--;
    }
    // num now contains the remainder of the division.
    return *this;
}